

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Action<int_(const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long)> *
__thiscall
testing::internal::DoAllAction::operator_cast_to_Action
          (Action<int_(const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long)>
           *__return_storage_ptr__,DoAllAction *this)

{
  ReturnAction *this_00;
  Op local_50;
  DoAllAction *local_18;
  DoAllAction<testing::PolymorphicAction<testing::internal::AssignAction<int,_int>_>,_testing::internal::ReturnAction<int>_>
  *this_local;
  
  local_18 = this;
  this_local = (DoAllAction<testing::PolymorphicAction<testing::internal::AssignAction<int,_int>_>,_testing::internal::ReturnAction<int>_>
                *)__return_storage_ptr__;
  DoAllAction<testing::PolymorphicAction<testing::internal::AssignAction<int,int>>,testing::internal::ReturnAction<int>>
  ::
  Convert<testing::Action<void(int_const*,unsigned_int,void*,unsigned_long*,void_const*,unsigned_long)>,0ul>
            ();
  this_00 = (ReturnAction *)
            std::
            get<1ul,testing::PolymorphicAction<testing::internal::AssignAction<int,int>>,testing::internal::ReturnAction<int>>
                      ((tuple<testing::PolymorphicAction<testing::internal::AssignAction<int,_int>_>,_testing::internal::ReturnAction<int>_>
                        *)this);
  ReturnAction::operator_cast_to_Action(&local_50.last,this_00);
  testing::Action::Action(testing::internal::DoAllAction::operator_cast_to_Action
            ((DoAllAction *)__return_storage_ptr__,&local_50);
  DoAllAction<testing::PolymorphicAction<testing::internal::AssignAction<int,_int>_>,_testing::internal::ReturnAction<int>_>
  ::
  operator_Action<int,_const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long>
  ::Op::~Op(&local_50);
  return __return_storage_ptr__;
}

Assistant:

operator Action<R(Args...)>() const {  // NOLINT
    struct Op {
      std::vector<Action<void(NonFinalType<Args>...)>> converted;
      Action<R(Args...)> last;
      R operator()(Args... args) const {
        auto tuple_args = std::forward_as_tuple(std::forward<Args>(args)...);
        for (auto& a : converted) {
          a.Perform(tuple_args);
        }
        return last.Perform(std::move(tuple_args));
      }
    };
    return Op{Convert<Action<void(NonFinalType<Args>...)>>(
                  MakeIndexSequence<sizeof...(Actions) - 1>()),
              std::get<sizeof...(Actions) - 1>(actions)};
  }